

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lattice.hpp
# Opt level: O0

void __thiscall OpenMD::Lattice::Lattice(Lattice *this)

{
  undefined8 *in_RDI;
  Vector3d *in_stack_ffffffffffffffc8;
  Lattice *this_00;
  
  *in_RDI = &PTR__Lattice_00508ff8;
  Vector3<double>::Vector3((Vector3<double> *)0x30ac26);
  this_00 = (Lattice *)(in_RDI + 5);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x30ac39)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x30ac4c)
  ;
  Vector3<double>::Vector3((Vector3<double> *)0x30ac5a);
  setOrigin(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

Lattice() { setOrigin(V3Zero); }